

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O0

bool __thiscall Doublet::operator==(Doublet *this,Doublet *rhs)

{
  bool bVar1;
  int *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  Gaussian *in_stack_ffffffffffffffd8;
  __type local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  
  __rhs = in_RDI;
  bVar1 = Gaussian::operator==((Gaussian *)in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    bVar1 = Gaussian::operator==((Gaussian *)in_RDI,in_stack_ffffffffffffffd8);
    local_11 = false;
    if ((bVar1) && (local_11 = false, *(int *)in_RDI == *in_RSI)) {
      local_11 = std::operator==(unaff_retaddr,__rhs);
    }
  }
  return local_11;
}

Assistant:

bool operator==(const Doublet & rhs) const
    {
        return (left == rhs.left &&
                right == rhs.right &&
                type == rhs.type &&
                tag == rhs.tag);
    }